

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O3

void ihevcd_copy_sps(codec_t *ps_codec,WORD32 sps_id,WORD32 sps_id_ref)

{
  sps_t *__dest;
  sps_t *psVar1;
  pps_t *ppVar2;
  WORD16 *__dest_00;
  long lVar3;
  sps_t *__src;
  
  psVar1 = ps_codec->ps_sps_base;
  __src = psVar1 + sps_id_ref;
  __dest = psVar1 + sps_id;
  if ((psVar1[sps_id].i1_sps_valid != '\0') &&
     (((__dest->i1_log2_ctb_size != __src->i1_log2_ctb_size ||
       (__dest->i2_pic_wd_in_ctb != __src->i2_pic_wd_in_ctb)) ||
      (__dest->i2_pic_ht_in_ctb != __src->i2_pic_ht_in_ctb)))) {
    ppVar2 = ps_codec->ps_pps_base;
    lVar3 = 0x4b;
    do {
      if ((ppVar2->au1_scaling_list_dc_coef[lVar3 + -0x36] != '\0') &&
         ((char)ppVar2->au1_scaling_list_dc_coef[lVar3 + -0x70] == sps_id)) {
        ppVar2->au1_scaling_list_dc_coef[lVar3 + -0x36] = '\0';
      }
      lVar3 = lVar3 + 0x50;
    } while ((int)lVar3 != 0x144b);
  }
  __dest_00 = __dest->pi2_scaling_mat;
  memcpy(__dest,__src,0x20c8);
  __dest->pi2_scaling_mat = __dest_00;
  memcpy(__dest_00,__src->pi2_scaling_mat,0x1fc0);
  __dest->i1_sps_valid = '\x01';
  (ps_codec->s_parse).ps_sps = __dest;
  return;
}

Assistant:

void ihevcd_copy_sps(codec_t *ps_codec, WORD32 sps_id, WORD32 sps_id_ref)
{
    sps_t *ps_sps, *ps_sps_ref;
    WORD16 *pi2_scaling_mat_backup;
    WORD32 scaling_mat_size;

    SCALING_MAT_SIZE(scaling_mat_size);
    ps_sps_ref = ps_codec->ps_sps_base + sps_id_ref;
    ps_sps = ps_codec->ps_sps_base + sps_id;

    if(ps_sps->i1_sps_valid)
    {
        if((ps_sps->i1_log2_ctb_size != ps_sps_ref->i1_log2_ctb_size) ||
                        (ps_sps->i2_pic_wd_in_ctb != ps_sps_ref->i2_pic_wd_in_ctb) ||
                        (ps_sps->i2_pic_ht_in_ctb != ps_sps_ref->i2_pic_ht_in_ctb))
        {
            ihevcd_unmark_pps(ps_codec, sps_id);
        }
    }

    pi2_scaling_mat_backup = ps_sps->pi2_scaling_mat;

    memcpy(ps_sps, ps_sps_ref, sizeof(sps_t));
    ps_sps->pi2_scaling_mat = pi2_scaling_mat_backup;
    memcpy(ps_sps->pi2_scaling_mat, ps_sps_ref->pi2_scaling_mat, scaling_mat_size * sizeof(WORD16));
    ps_sps->i1_sps_valid = 1;

    ps_codec->s_parse.ps_sps = ps_sps;
}